

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primetest.cpp
# Opt level: O3

bool witness(int a,int n)

{
  bool bVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  long lVar4;
  long lVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  
  iVar6 = 0;
  uVar8 = n;
  do {
    uVar7 = uVar8;
    uVar8 = (int)uVar7 / 2;
    iVar6 = iVar6 + 1;
  } while ((uVar8 & 1) == 0);
  if (uVar7 + 1 < 3) {
    lVar4 = 1;
  }
  else {
    lVar5 = (long)a;
    lVar4 = 1;
    do {
      if ((uVar8 & 1) != 0) {
        lVar4 = (lVar4 * lVar5) % (long)n;
      }
      auVar2._8_8_ = 0;
      auVar2._0_8_ = lVar5 * lVar5;
      lVar5 = SUB168(auVar2 % SEXT816((long)n),0);
      bVar1 = 1 < uVar8;
      uVar8 = (int)uVar8 >> 1;
    } while (bVar1);
  }
  while( true ) {
    auVar3._8_8_ = 0;
    auVar3._0_8_ = lVar4 * lVar4;
    lVar5 = SUB168(auVar3 % SEXT816((long)n),0);
    if (((lVar4 != 1) && (lVar5 == 1)) && (lVar4 != n + -1)) break;
    iVar6 = iVar6 + -1;
    lVar4 = lVar5;
    if (iVar6 == 0) {
      return lVar5 != 1;
    }
  }
  return true;
}

Assistant:

bool witness(int a, int n)
{
	int t, u, i;
	int64_t prev, curr;

	u = n / 2;
	t = 1;
	while (!(u & 1))
	{
		u /= 2;
		++t;
	}

	prev = power(a, u, n);
	for (i = 1; i <= t; ++i)
	{
		curr = (prev*prev) % n;
		if ((curr == 1) && (prev != 1) && (prev != n - 1))
			return true;
		prev = curr;
	}
	if (curr != 1)
		return true;
	return false;
}